

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool __thiscall slang::ast::LookupResult::hasError(LookupResult *this)

{
  bool bVar1;
  const_iterator pDVar2;
  long *in_RDI;
  Diagnostic *diag;
  const_iterator __end2;
  const_iterator __begin2;
  Diagnostics *__range2;
  bitmask<slang::ast::LookupResultFlags> *in_stack_ffffffffffffffa8;
  Diagnostic *in_stack_ffffffffffffffb0;
  bool local_39;
  const_iterator local_28;
  bool local_1;
  
  local_39 = false;
  if (*in_RDI == 0) {
    in_stack_ffffffffffffffb0 = (Diagnostic *)((long)in_RDI + 0x14);
    ast::operator|(None,None);
    local_39 = bitmask<slang::ast::LookupResultFlags>::has
                         ((bitmask<slang::ast::LookupResultFlags> *)in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
  }
  if (local_39 == false) {
    local_28 = SmallVectorBase<slang::Diagnostic>::begin
                         ((SmallVectorBase<slang::Diagnostic> *)(in_RDI + 0x29));
    pDVar2 = SmallVectorBase<slang::Diagnostic>::end
                       ((SmallVectorBase<slang::Diagnostic> *)(in_RDI + 0x29));
    for (; local_28 != pDVar2; local_28 = local_28 + 1) {
      bVar1 = Diagnostic::isError(in_stack_ffffffffffffffb0);
      if (bVar1) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool LookupResult::hasError() const {
    // We have an error if we have any diagnostics or if there was a missing explicit import.
    if (!found && flags.has(LookupResultFlags::WasImported | LookupResultFlags::SuppressUndeclared))
        return true;

    for (auto& diag : diagnostics) {
        if (diag.isError())
            return true;
    }

    return false;
}